

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

bool cmDependsFortran::CopyModule
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  string *stampFile;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  Status SVar7;
  ostream *poVar8;
  bool bVar9;
  string *filename;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  string mod_dir;
  string mod_upper;
  string mod_lower;
  string mod;
  string compilerId;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (0x80 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  local_f0._M_dataplus._M_p = (pointer)local_90._M_string_length;
  local_f0._M_string_length = (size_type)local_90._M_dataplus._M_p;
  if (local_90._M_string_length < (pointer)0x4) {
LAB_004f0521:
    local_f0._M_dataplus._M_p = (pointer)local_90._M_string_length;
    local_f0._M_string_length = (size_type)local_90._M_dataplus._M_p;
    if ((pointer)0x4 < local_90._M_string_length) {
      __str_00._M_str = ".smod";
      __str_00._M_len = 5;
      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_f0,
                         (size_type)(local_90._M_string_length + -5),5,__str_00);
      if (iVar6 == 0) goto LAB_004f05ac;
    }
    local_f0._M_dataplus._M_p = (pointer)local_90._M_string_length;
    local_f0._M_string_length = (size_type)local_90._M_dataplus._M_p;
    if ((pointer)0x3 < local_90._M_string_length) {
      __str_01._M_str = ".sub";
      __str_01._M_len = 4;
      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_f0,
                         (size_type)(local_90._M_string_length + -4),4,__str_01);
      if (iVar6 == 0) goto LAB_004f05ac;
    }
    std::__cxx11::string::append((char *)&local_90);
  }
  else {
    __str._M_str = ".mod";
    __str._M_len = 4;
    iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_f0,
                       (size_type)(local_90._M_string_length + -4),4,__str);
    if (iVar6 != 0) goto LAB_004f0521;
  }
LAB_004f05ac:
  cmsys::SystemTools::GetFilenamePath(&local_f0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::__cxx11::string::append((char *)&local_f0);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_f0._M_dataplus._M_p,
             (char *)(local_f0._M_string_length + (long)local_f0._M_dataplus._M_p));
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_f0._M_dataplus._M_p,
             (char *)(local_f0._M_string_length + (long)local_f0._M_dataplus._M_p));
  cmsys::SystemTools::GetFilenameName(&local_50,&local_90);
  cmFortranModuleAppendUpperLower(&local_50,&local_d0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar5 = cmsys::SystemTools::FileExists(&local_d0,true);
  stampFile = pbVar2 + 3;
  if (bVar5) {
    bVar5 = ModulesDiffer(&local_d0,stampFile,&local_70);
    bVar9 = true;
    if (!bVar5) goto LAB_004f0825;
    SVar7 = cmsys::SystemTools::CopyFileAlways(&local_d0,stampFile);
    if (SVar7.Kind_ == Success) goto LAB_004f0825;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error copying Fortran module from \"",0x23);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" to \"",6);
LAB_004f0783:
    psVar4 = pbVar2 + 3;
    filename = stampFile;
  }
  else {
    filename = &local_b0;
    bVar5 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar5) {
      bVar5 = ModulesDiffer(&local_b0,stampFile,&local_70);
      bVar9 = true;
      if (!bVar5) goto LAB_004f0825;
      SVar7 = cmsys::SystemTools::CopyFileAlways(&local_b0,stampFile);
      if (SVar7.Kind_ == Success) goto LAB_004f0825;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error copying Fortran module from \"",0x23);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_b0._M_dataplus._M_p,local_b0._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" to \"",6);
      goto LAB_004f0783;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error copying Fortran module \"",0x1e);
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,pbVar2[2]._M_dataplus._M_p,pbVar2[2]._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".  Tried \"",0xb);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" and \"",7);
    psVar4 = &local_b0;
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(filename->_M_dataplus)._M_p,psVar4->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".\n",3);
  bVar9 = false;
LAB_004f0825:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

bool cmDependsFortran::CopyModule(const std::vector<std::string>& args)
{
  // Implements
  //
  //   $(CMAKE_COMMAND) -E cmake_copy_f90_mod input.mod output.mod.stamp
  //                                          [compiler-id]
  //
  // Note that the case of the .mod file depends on the compiler.  In
  // the future this copy could also account for the fact that some
  // compilers include a timestamp in the .mod file so it changes even
  // when the interface described in the module does not.

  std::string mod = args[2];
  std::string const& stamp = args[3];
  std::string compilerId;
  if (args.size() >= 5) {
    compilerId = args[4];
  }
  if (!cmHasLiteralSuffix(mod, ".mod") && !cmHasLiteralSuffix(mod, ".smod") &&
      !cmHasLiteralSuffix(mod, ".sub")) {
    // Support depend.make files left by older versions of CMake.
    // They do not include the ".mod" extension.
    mod += ".mod";
  }
  std::string mod_dir = cmSystemTools::GetFilenamePath(mod);
  if (!mod_dir.empty()) {
    mod_dir += "/";
  }
  std::string mod_upper = mod_dir;
  std::string mod_lower = mod_dir;
  cmFortranModuleAppendUpperLower(cmSystemTools::GetFilenameName(mod),
                                  mod_upper, mod_lower);
  if (cmSystemTools::FileExists(mod_upper, true)) {
    if (cmDependsFortran::ModulesDiffer(mod_upper, stamp, compilerId)) {
      if (!cmSystemTools::CopyFileAlways(mod_upper, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_upper
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }
  if (cmSystemTools::FileExists(mod_lower, true)) {
    if (cmDependsFortran::ModulesDiffer(mod_lower, stamp, compilerId)) {
      if (!cmSystemTools::CopyFileAlways(mod_lower, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_lower
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }

  std::cerr << "Error copying Fortran module \"" << args[2] << "\".  Tried \""
            << mod_upper << "\" and \"" << mod_lower << "\".\n";
  return false;
}